

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribution_test_util.cc
# Opt level: O2

ostream * absl::lts_20240722::random_internal::operator<<(ostream *os,DistributionMoments *moments)

{
  ostream *poVar1;
  FormatSpec<double,_double,_double,_double> local_58;
  double local_48;
  lts_20240722 local_40 [32];
  
  local_58.super_type.spec_.data_ = "mean=%f, stddev=%f, skewness=%f, kurtosis=%f";
  local_58.super_type.spec_.size_ = 0x2c;
  local_48 = moments->variance;
  if (local_48 < 0.0) {
    local_48 = sqrt(local_48);
  }
  else {
    local_48 = SQRT(local_48);
  }
  StrFormat<double,_double,_double,_double>
            (local_40,&local_58,&moments->mean,&local_48,&moments->skewness,&moments->kurtosis);
  poVar1 = std::operator<<(os,(string *)local_40);
  std::__cxx11::string::~string((string *)local_40);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const DistributionMoments& moments) {
  return os << absl::StrFormat("mean=%f, stddev=%f, skewness=%f, kurtosis=%f",
                               moments.mean, std::sqrt(moments.variance),
                               moments.skewness, moments.kurtosis);
}